

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceObjectArchive::Serialize(DeviceObjectArchive *this,IFileStream *pStream)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RefCntAutoPtr<Diligent::IDataBlob> *Args_1;
  RefCntAutoPtr<Diligent::IDataBlob> pDataBlob;
  string msg;
  RefCntAutoPtr<Diligent::IDataBlob> local_40;
  string local_38;
  
  if (pStream == (IFileStream *)0x0) {
    FormatString<char[29]>(&local_38,(char (*) [29])"File stream must not be null");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x29d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  Args_1 = &local_40;
  local_40.m_pObject = (IDataBlob *)0x0;
  local_38._M_dataplus._M_p = (Char *)0x0;
  local_38._M_string_length = (size_type)Args_1;
  Serialize(this,(IDataBlob **)&local_38);
  RefCntAutoPtr<Diligent::IDataBlob>::DoublePtrHelper<Diligent::IDataBlob>::~DoublePtrHelper
            ((DoublePtrHelper<Diligent::IDataBlob> *)&local_38);
  if (local_40.m_pObject == (IDataBlob *)0x0) {
    FormatString<char[26],char[10]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pDataBlob",
               (char (*) [10])Args_1);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = (*((local_40.m_pObject)->super_IObject)._vptr_IObject[7])(local_40.m_pObject,0);
  iVar2 = (*((local_40.m_pObject)->super_IObject)._vptr_IObject[5])();
  (*(pStream->super_IObject)._vptr_IObject[6])
            (pStream,CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2));
  if (local_40.m_pObject != (IDataBlob *)0x0) {
    (*((local_40.m_pObject)->super_IObject)._vptr_IObject[2])();
  }
  return;
}

Assistant:

void DeviceObjectArchive::Serialize(IFileStream* pStream) const
{
    DEV_CHECK_ERR(pStream != nullptr, "File stream must not be null");
    RefCntAutoPtr<IDataBlob> pDataBlob;
    Serialize(&pDataBlob);
    VERIFY_EXPR(pDataBlob);
    pStream->Write(pDataBlob->GetConstDataPtr(), pDataBlob->GetSize());
}